

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

void __thiscall
peg::CharacterClass::CharacterClass(CharacterClass *this,string *s,bool negated,bool ignore_case)

{
  bool bVar1;
  uint uVar2;
  peg *this_00;
  char *s8;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  undefined7 in_register_00000009;
  size_t l;
  pair<char32_t,_char32_t> local_6c;
  value_type local_64;
  value_type cp;
  value_type local_58;
  value_type local_54;
  value_type cp2;
  value_type cp1;
  uint i;
  undefined1 local_40 [8];
  u32string chars;
  bool ignore_case_local;
  bool negated_local;
  string *s_local;
  CharacterClass *this_local;
  
  uVar3 = CONCAT71(in_register_00000009,negated) & 0xffffffffffffff01;
  chars.field_2._M_local_buf[3]._3_1_ = (undefined1)uVar3;
  chars.field_2._M_local_buf[3]._2_1_ = ignore_case;
  Ope::Ope(&this->super_Ope);
  std::enable_shared_from_this<peg::CharacterClass>::enable_shared_from_this
            (&this->super_enable_shared_from_this<peg::CharacterClass>);
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__CharacterClass_00210d50;
  std::vector<std::pair<char32_t,_char32_t>,_std::allocator<std::pair<char32_t,_char32_t>_>_>::
  vector(&this->ranges_);
  uVar3 = CONCAT71((int7)(uVar3 >> 8),chars.field_2._M_local_buf[3]._3_1_) & 0xffffffffffffff01;
  this->negated_ = SUB81(uVar3,0);
  l = CONCAT71((int7)(uVar3 >> 8),chars.field_2._M_local_buf[3]._2_1_) & 0xffffffffffffff01;
  this->ignore_case_ = SUB81(l,0);
  this_00 = (peg *)std::__cxx11::string::data();
  s8 = (char *)std::__cxx11::string::length();
  decode_abi_cxx11_((u32string *)local_40,this_00,s8,l);
  cp2 = L'\0';
  while (uVar3 = (ulong)(uint)cp2,
        sVar4 = std::__cxx11::
                basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                          ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                            *)local_40), uVar3 < sVar4) {
    uVar2 = cp2 + L'\x02';
    sVar4 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)local_40);
    if ((uVar2 < sVar4) &&
       (pvVar5 = std::__cxx11::
                 basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
                 operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)local_40,(ulong)(uint)(cp2 + L'\x01')), *pvVar5 == L'-')) {
      pvVar5 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
               operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)local_40,(ulong)(uint)cp2);
      local_54 = *pvVar5;
      pvVar5 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
               operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)local_40,(ulong)(uint)(cp2 + L'\x02'));
      local_58 = *pvVar5;
      std::pair<char32_t,_char32_t>::pair<char32_t_&,_char32_t_&,_true>
                ((pair<char32_t,_char32_t> *)&stack0xffffffffffffffa0,&local_54,&local_58);
      std::vector<std::pair<char32_t,char32_t>,std::allocator<std::pair<char32_t,char32_t>>>::
      emplace_back<std::pair<char32_t,char32_t>>
                ((vector<std::pair<char32_t,char32_t>,std::allocator<std::pair<char32_t,char32_t>>>
                  *)&this->ranges_,(pair<char32_t,_char32_t> *)&stack0xffffffffffffffa0);
      cp2 = cp2 + L'\x03';
    }
    else {
      pvVar5 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
               operator[]((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)local_40,(ulong)(uint)cp2);
      local_64 = *pvVar5;
      std::pair<char32_t,_char32_t>::pair<char32_t_&,_char32_t_&,_true>
                (&local_6c,&local_64,&local_64);
      std::vector<std::pair<char32_t,char32_t>,std::allocator<std::pair<char32_t,char32_t>>>::
      emplace_back<std::pair<char32_t,char32_t>>
                ((vector<std::pair<char32_t,char32_t>,std::allocator<std::pair<char32_t,char32_t>>>
                  *)&this->ranges_,&local_6c);
      cp2 = cp2 + L'\x01';
    }
  }
  bVar1 = std::
          vector<std::pair<char32_t,_char32_t>,_std::allocator<std::pair<char32_t,_char32_t>_>_>::
          empty(&this->ranges_);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::u32string::~u32string((u32string *)local_40);
    return;
  }
  __assert_fail("!ranges_.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/yhirose[P]culebra/./vendor/cpp-peglib/peglib.h"
                ,0x4ba,"peg::CharacterClass::CharacterClass(const std::string &, bool, bool)");
}

Assistant:

CharacterClass(const std::string &s, bool negated, bool ignore_case)
      : negated_(negated), ignore_case_(ignore_case) {
    auto chars = decode(s.data(), s.length());
    auto i = 0u;
    while (i < chars.size()) {
      if (i + 2 < chars.size() && chars[i + 1] == '-') {
        auto cp1 = chars[i];
        auto cp2 = chars[i + 2];
        ranges_.emplace_back(std::pair(cp1, cp2));
        i += 3;
      } else {
        auto cp = chars[i];
        ranges_.emplace_back(std::pair(cp, cp));
        i += 1;
      }
    }
    assert(!ranges_.empty());
  }